

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data.cpp
# Opt level: O2

void __thiscall create::Data::Data(Data *this,ProtocolVersion version)

{
  _Rb_tree_header *p_Var1;
  __shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  _Base_ptr p_Var3;
  key_type local_41;
  __shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2> local_40;
  char local_2c [4];
  
  p_Var1 = &(this->packets)._M_t._M_impl.super__Rb_tree_header;
  (this->packets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->packets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->packets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->packets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->packets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->ids).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->ids).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->ids).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (version != ~V_ALL) {
    local_2c[0] = '\x01';
    local_2c[1] = '\0';
    local_2c[2] = '\0';
    local_2c[3] = '\0';
    std::make_shared<create::Packet,int,char_const(&)[17]>((int *)&local_40,(char (*) [17])local_2c)
    ;
    local_41 = '\a';
    p_Var2 = &std::
              map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
              ::operator[](&this->packets,&local_41)->
              super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>::operator=(p_Var2,&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    local_2c[0] = '\x01';
    local_2c[1] = '\0';
    local_2c[2] = '\0';
    local_2c[3] = '\0';
    std::make_shared<create::Packet,int,char_const(&)[5]>((int *)&local_40,(char (*) [5])local_2c);
    local_41 = '\b';
    p_Var2 = &std::
              map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
              ::operator[](&this->packets,&local_41)->
              super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>::operator=(p_Var2,&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    local_2c[0] = '\x01';
    local_2c[1] = '\0';
    local_2c[2] = '\0';
    local_2c[3] = '\0';
    std::make_shared<create::Packet,int,char_const(&)[11]>((int *)&local_40,(char (*) [11])local_2c)
    ;
    local_41 = '\t';
    p_Var2 = &std::
              map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
              ::operator[](&this->packets,&local_41)->
              super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>::operator=(p_Var2,&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    local_2c[0] = '\x01';
    local_2c[1] = '\0';
    local_2c[2] = '\0';
    local_2c[3] = '\0';
    std::make_shared<create::Packet,int,char_const(&)[17]>((int *)&local_40,(char (*) [17])local_2c)
    ;
    local_41 = '\n';
    p_Var2 = &std::
              map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
              ::operator[](&this->packets,&local_41)->
              super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>::operator=(p_Var2,&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    local_2c[0] = '\x01';
    local_2c[1] = '\0';
    local_2c[2] = '\0';
    local_2c[3] = '\0';
    std::make_shared<create::Packet,int,char_const(&)[18]>((int *)&local_40,(char (*) [18])local_2c)
    ;
    local_41 = '\v';
    p_Var2 = &std::
              map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
              ::operator[](&this->packets,&local_41)->
              super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>::operator=(p_Var2,&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    local_2c[0] = '\x01';
    local_2c[1] = '\0';
    local_2c[2] = '\0';
    local_2c[3] = '\0';
    std::make_shared<create::Packet,int,char_const(&)[12]>((int *)&local_40,(char (*) [12])local_2c)
    ;
    local_41 = '\f';
    p_Var2 = &std::
              map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
              ::operator[](&this->packets,&local_41)->
              super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>::operator=(p_Var2,&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    local_2c[0] = '\x01';
    local_2c[1] = '\0';
    local_2c[2] = '\0';
    local_2c[3] = '\0';
    std::make_shared<create::Packet,int,char_const(&)[13]>((int *)&local_40,(char (*) [13])local_2c)
    ;
    local_41 = '\r';
    p_Var2 = &std::
              map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
              ::operator[](&this->packets,&local_41)->
              super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>::operator=(p_Var2,&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    local_2c[0] = '\x01';
    local_2c[1] = '\0';
    local_2c[2] = '\0';
    local_2c[3] = '\0';
    std::make_shared<create::Packet,int,char_const(&)[13]>((int *)&local_40,(char (*) [13])local_2c)
    ;
    local_41 = '\x0e';
    p_Var2 = &std::
              map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
              ::operator[](&this->packets,&local_41)->
              super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>::operator=(p_Var2,&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    local_2c[0] = '\x01';
    local_2c[1] = '\0';
    local_2c[2] = '\0';
    local_2c[3] = '\0';
    std::make_shared<create::Packet,int,char_const(&)[17]>((int *)&local_40,(char (*) [17])local_2c)
    ;
    local_41 = '\x0f';
    p_Var2 = &std::
              map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
              ::operator[](&this->packets,&local_41)->
              super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>::operator=(p_Var2,&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    if ((version & V_1) != ~V_ALL) {
      local_2c[0] = '\x01';
      local_2c[1] = '\0';
      local_2c[2] = '\0';
      local_2c[3] = '\0';
      std::make_shared<create::Packet,int,char_const(&)[18]>
                ((int *)&local_40,(char (*) [18])local_2c);
      local_41 = '\x10';
      p_Var2 = &std::
                map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
                ::operator[](&this->packets,&local_41)->
                super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>::operator=(p_Var2,&local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    }
    local_2c[0] = '\x01';
    local_2c[1] = '\0';
    local_2c[2] = '\0';
    local_2c[3] = '\0';
    std::make_shared<create::Packet,int,char_const(&)[10]>((int *)&local_40,(char (*) [10])local_2c)
    ;
    local_41 = '\x11';
    p_Var2 = &std::
              map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
              ::operator[](&this->packets,&local_41)->
              super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>::operator=(p_Var2,&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    local_2c[0] = '\x01';
    local_2c[1] = '\0';
    local_2c[2] = '\0';
    local_2c[3] = '\0';
    std::make_shared<create::Packet,int,char_const(&)[8]>((int *)&local_40,(char (*) [8])local_2c);
    local_41 = '\x12';
    p_Var2 = &std::
              map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
              ::operator[](&this->packets,&local_41)->
              super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>::operator=(p_Var2,&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    if ((version & (V_2|V_1)) != ~V_ALL) {
      local_2c[0] = '\x02';
      local_2c[1] = '\0';
      local_2c[2] = '\0';
      local_2c[3] = '\0';
      std::make_shared<create::Packet,int,char_const(&)[9]>((int *)&local_40,(char (*) [9])local_2c)
      ;
      local_41 = '\x13';
      p_Var2 = &std::
                map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
                ::operator[](&this->packets,&local_41)->
                super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>::operator=(p_Var2,&local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
      local_2c[0] = '\x02';
      local_2c[1] = '\0';
      local_2c[2] = '\0';
      local_2c[3] = '\0';
      std::make_shared<create::Packet,int,char_const(&)[6]>((int *)&local_40,(char (*) [6])local_2c)
      ;
      local_41 = '\x14';
      p_Var2 = &std::
                map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
                ::operator[](&this->packets,&local_41)->
                super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>::operator=(p_Var2,&local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    }
    local_2c[0] = '\x01';
    local_2c[1] = '\0';
    local_2c[2] = '\0';
    local_2c[3] = '\0';
    std::make_shared<create::Packet,int,char_const(&)[15]>((int *)&local_40,(char (*) [15])local_2c)
    ;
    local_41 = '\x15';
    p_Var2 = &std::
              map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
              ::operator[](&this->packets,&local_41)->
              super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>::operator=(p_Var2,&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    local_2c[0] = '\x02';
    local_2c[1] = '\0';
    local_2c[2] = '\0';
    local_2c[3] = '\0';
    std::make_shared<create::Packet,int,char_const(&)[8]>((int *)&local_40,(char (*) [8])local_2c);
    local_41 = '\x16';
    p_Var2 = &std::
              map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
              ::operator[](&this->packets,&local_41)->
              super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>::operator=(p_Var2,&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    local_2c[0] = '\x02';
    local_2c[1] = '\0';
    local_2c[2] = '\0';
    local_2c[3] = '\0';
    std::make_shared<create::Packet,int,char_const(&)[8]>((int *)&local_40,(char (*) [8])local_2c);
    local_41 = '\x17';
    p_Var2 = &std::
              map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
              ::operator[](&this->packets,&local_41)->
              super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>::operator=(p_Var2,&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    local_2c[0] = '\x01';
    local_2c[1] = '\0';
    local_2c[2] = '\0';
    local_2c[3] = '\0';
    std::make_shared<create::Packet,int,char_const(&)[12]>((int *)&local_40,(char (*) [12])local_2c)
    ;
    local_41 = '\x18';
    p_Var2 = &std::
              map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
              ::operator[](&this->packets,&local_41)->
              super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>::operator=(p_Var2,&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    local_2c[0] = '\x02';
    local_2c[1] = '\0';
    local_2c[2] = '\0';
    local_2c[3] = '\0';
    std::make_shared<create::Packet,int,char_const(&)[15]>((int *)&local_40,(char (*) [15])local_2c)
    ;
    local_41 = '\x19';
    p_Var2 = &std::
              map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
              ::operator[](&this->packets,&local_41)->
              super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>::operator=(p_Var2,&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    local_2c[0] = '\x02';
    local_2c[1] = '\0';
    local_2c[2] = '\0';
    local_2c[3] = '\0';
    std::make_shared<create::Packet,int,char_const(&)[17]>((int *)&local_40,(char (*) [17])local_2c)
    ;
    local_41 = '\x1a';
    p_Var2 = &std::
              map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
              ::operator[](&this->packets,&local_41)->
              super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>::operator=(p_Var2,&local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    if ((version & (V_3|V_2)) != ~V_ALL) {
      local_2c[0] = '\x01';
      local_2c[1] = '\0';
      local_2c[2] = '\0';
      local_2c[3] = '\0';
      std::make_shared<create::Packet,int,char_const(&)[8]>((int *)&local_40,(char (*) [8])local_2c)
      ;
      local_41 = '#';
      p_Var2 = &std::
                map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
                ::operator[](&this->packets,&local_41)->
                super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>::operator=(p_Var2,&local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    }
    if ((version & V_3) != ~V_ALL) {
      local_2c[0] = '\x02';
      local_2c[1] = '\0';
      local_2c[2] = '\0';
      local_2c[3] = '\0';
      std::make_shared<create::Packet,int,char_const(&)[16]>
                ((int *)&local_40,(char (*) [16])local_2c);
      local_41 = '+';
      p_Var2 = &std::
                map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
                ::operator[](&this->packets,&local_41)->
                super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>::operator=(p_Var2,&local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
      local_2c[0] = '\x02';
      local_2c[1] = '\0';
      local_2c[2] = '\0';
      local_2c[3] = '\0';
      std::make_shared<create::Packet,int,char_const(&)[17]>
                ((int *)&local_40,(char (*) [17])local_2c);
      local_41 = ',';
      p_Var2 = &std::
                map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
                ::operator[](&this->packets,&local_41)->
                super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>::operator=(p_Var2,&local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
      local_2c[0] = '\x01';
      local_2c[1] = '\0';
      local_2c[2] = '\0';
      local_2c[3] = '\0';
      std::make_shared<create::Packet,int,char_const(&)[13]>
                ((int *)&local_40,(char (*) [13])local_2c);
      local_41 = '-';
      p_Var2 = &std::
                map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
                ::operator[](&this->packets,&local_41)->
                super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>::operator=(p_Var2,&local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
      local_2c[0] = '\x02';
      local_2c[1] = '\0';
      local_2c[2] = '\0';
      local_2c[3] = '\0';
      std::make_shared<create::Packet,int,char_const(&)[18]>
                ((int *)&local_40,(char (*) [18])local_2c);
      local_41 = '.';
      p_Var2 = &std::
                map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
                ::operator[](&this->packets,&local_41)->
                super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>::operator=(p_Var2,&local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
      local_2c[0] = '\x02';
      local_2c[1] = '\0';
      local_2c[2] = '\0';
      local_2c[3] = '\0';
      std::make_shared<create::Packet,int,char_const(&)[24]>
                ((int *)&local_40,(char (*) [24])local_2c);
      local_41 = '/';
      p_Var2 = &std::
                map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
                ::operator[](&this->packets,&local_41)->
                super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>::operator=(p_Var2,&local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
      local_2c[0] = '\x02';
      local_2c[1] = '\0';
      local_2c[2] = '\0';
      local_2c[3] = '\0';
      std::make_shared<create::Packet,int,char_const(&)[25]>
                ((int *)&local_40,(char (*) [25])local_2c);
      local_41 = '0';
      p_Var2 = &std::
                map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
                ::operator[](&this->packets,&local_41)->
                super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>::operator=(p_Var2,&local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
      local_2c[0] = '\x02';
      local_2c[1] = '\0';
      local_2c[2] = '\0';
      local_2c[3] = '\0';
      std::make_shared<create::Packet,int,char_const(&)[26]>
                ((int *)&local_40,(char (*) [26])local_2c);
      local_41 = '1';
      p_Var2 = &std::
                map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
                ::operator[](&this->packets,&local_41)->
                super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>::operator=(p_Var2,&local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
      local_2c[0] = '\x02';
      local_2c[1] = '\0';
      local_2c[2] = '\0';
      local_2c[3] = '\0';
      std::make_shared<create::Packet,int,char_const(&)[25]>
                ((int *)&local_40,(char (*) [25])local_2c);
      local_41 = '2';
      p_Var2 = &std::
                map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
                ::operator[](&this->packets,&local_41)->
                super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>::operator=(p_Var2,&local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
      local_2c[0] = '\x02';
      local_2c[1] = '\0';
      local_2c[2] = '\0';
      local_2c[3] = '\0';
      std::make_shared<create::Packet,int,char_const(&)[19]>
                ((int *)&local_40,(char (*) [19])local_2c);
      local_41 = '3';
      p_Var2 = &std::
                map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
                ::operator[](&this->packets,&local_41)->
                super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>::operator=(p_Var2,&local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
      local_2c[0] = '\x01';
      local_2c[1] = '\0';
      local_2c[2] = '\0';
      local_2c[3] = '\0';
      std::make_shared<create::Packet,int,char_const(&)[15]>
                ((int *)&local_40,(char (*) [15])local_2c);
      local_41 = '4';
      p_Var2 = &std::
                map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
                ::operator[](&this->packets,&local_41)->
                super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>::operator=(p_Var2,&local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
      local_2c[0] = '\x01';
      local_2c[1] = '\0';
      local_2c[2] = '\0';
      local_2c[3] = '\0';
      std::make_shared<create::Packet,int,char_const(&)[16]>
                ((int *)&local_40,(char (*) [16])local_2c);
      local_41 = '5';
      p_Var2 = &std::
                map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
                ::operator[](&this->packets,&local_41)->
                super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>::operator=(p_Var2,&local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
      local_2c[0] = '\x01';
      local_2c[1] = '\0';
      local_2c[2] = '\0';
      local_2c[3] = '\0';
      std::make_shared<create::Packet,int,char_const(&)[7]>((int *)&local_40,(char (*) [7])local_2c)
      ;
      local_41 = ':';
      p_Var2 = &std::
                map<unsigned_char,_std::shared_ptr<create::Packet>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<create::Packet>_>_>_>
                ::operator[](&this->packets,&local_41)->
                super___shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<create::Packet,_(__gnu_cxx::_Lock_policy)2>::operator=(p_Var2,&local_40);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
    }
  }
  this->totalDataBytes = 0;
  for (p_Var3 = (this->packets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != p_Var1; p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3)) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
              (&this->ids,(value_type_conflict2 *)(p_Var3 + 1));
    this->totalDataBytes = this->totalDataBytes + (uint)*(byte *)&p_Var3[1]._M_parent[2]._M_right;
  }
  return;
}

Assistant:

Data::Data(ProtocolVersion version) {
    // Populate data map
    /* * * * * * * * * * * * * * * * * * * * * * * * * * * * * * *
     *  WARNING: Adding too many packets will flood the serial   *
     *           buffer and corrupt the stream.                  *
     * * * * * * * * * * * * * * * * * * * * * * * * * * * * * * */
    ADD_PACKET(ID_BUMP_WHEELDROP, 1, "bumps_wheeldrops", V_ALL);
    ADD_PACKET(ID_WALL, 1, "wall", V_ALL);
    ADD_PACKET(ID_CLIFF_LEFT, 1, "cliff_left", V_ALL);
    ADD_PACKET(ID_CLIFF_FRONT_LEFT, 1, "cliff_front_left", V_ALL);
    ADD_PACKET(ID_CLIFF_FRONT_RIGHT, 1, "cliff_front_right", V_ALL);
    ADD_PACKET(ID_CLIFF_RIGHT, 1, "cliff_right", V_ALL);
    ADD_PACKET(ID_VIRTUAL_WALL, 1, "virtual_wall", V_ALL);
    ADD_PACKET(ID_OVERCURRENTS, 1, "overcurrents", V_ALL);
    ADD_PACKET(ID_DIRT_DETECT_LEFT, 1, "dirt_detect_left", V_ALL);
    ADD_PACKET(ID_DIRT_DETECT_RIGHT, 1, "dirt_detect_right", V_1);
    ADD_PACKET(ID_IR_OMNI, 1, "ir_opcode", V_ALL);
    ADD_PACKET(ID_BUTTONS, 1, "buttons", V_ALL);
    ADD_PACKET(ID_DISTANCE, 2, "distance", V_1 | V_2);
    ADD_PACKET(ID_ANGLE, 2, "angle", V_1 | V_2);
    ADD_PACKET(ID_CHARGE_STATE, 1, "charging_state", V_ALL);
    ADD_PACKET(ID_VOLTAGE, 2, "voltage", V_ALL);
    ADD_PACKET(ID_CURRENT, 2, "current", V_ALL);
    ADD_PACKET(ID_TEMP, 1, "temperature", V_ALL);
    ADD_PACKET(ID_CHARGE , 2, "battery_charge", V_ALL);
    ADD_PACKET(ID_CAPACITY, 2, "battery_capacity", V_ALL);
    ADD_PACKET(ID_OI_MODE, 1, "oi_mode", V_2 | V_3);
    ADD_PACKET(ID_LEFT_ENC, 2, "enc_counts_left", V_3);
    ADD_PACKET(ID_RIGHT_ENC, 2, "enc_counts_right", V_3);
    ADD_PACKET(ID_LIGHT, 1, "light_bumper", V_3);
    ADD_PACKET(ID_LIGHT_LEFT, 2, "light_bumper_left", V_3);
    ADD_PACKET(ID_LIGHT_FRONT_LEFT, 2, "light_bumper_front_left", V_3);
    ADD_PACKET(ID_LIGHT_CENTER_LEFT, 2, "light_bumper_center_left", V_3);
    ADD_PACKET(ID_LIGHT_CENTER_RIGHT, 2, "light_bumper_center_right", V_3);
    ADD_PACKET(ID_LIGHT_FRONT_RIGHT, 2, "light_bumper_front_right", V_3);
    ADD_PACKET(ID_LIGHT_RIGHT, 2, "light_bumper_right", V_3);
    ADD_PACKET(ID_IR_LEFT, 1, "ir_opcode_left", V_3);
    ADD_PACKET(ID_IR_RIGHT, 1, "ir_opcode_right", V_3);
    ADD_PACKET(ID_STASIS, 1, "stasis", V_3);

    totalDataBytes = 0;
    for (std::map<uint8_t, std::shared_ptr<Packet> >::iterator it = packets.begin();
         it != packets.end();
         ++it) {
      ids.push_back(it->first);
      totalDataBytes += it->second->nbytes;
    }
  }